

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::PushColumnClipRect(int column_index)

{
  ImGuiOldColumns *pIVar1;
  ImGuiOldColumnData *pIVar2;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (column_index < 0) {
    column_index = pIVar1->Current;
  }
  pIVar2 = ImVector<ImGuiOldColumnData>::operator[](&pIVar1->Columns,column_index);
  PushClipRect(&(pIVar2->ClipRect).Min,&(pIVar2->ClipRect).Max,false);
  return;
}

Assistant:

void ImGui::PushColumnClipRect(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (column_index < 0)
        column_index = columns->Current;

    ImGuiOldColumnData* column = &columns->Columns[column_index];
    PushClipRect(column->ClipRect.Min, column->ClipRect.Max, false);
}